

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool cmakeCheckStampList(char *stampList)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  char *stampName_00;
  undefined1 local_250 [8];
  string stampName;
  long local_220;
  ifstream fin;
  char *stampList_local;
  
  bVar1 = cmsys::SystemTools::FileExists(stampList);
  if (bVar1) {
    std::ifstream::ifstream(&local_220,stampList,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)local_250);
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_220,(string *)local_250,(bool *)0x0,-1);
        if (!bVar1) {
          stampList_local._7_1_ = true;
          goto LAB_006b524c;
        }
        stampName_00 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmakeCheckStampFile(stampName_00);
      } while (bVar1);
      stampList_local._7_1_ = false;
LAB_006b524c:
      stampName.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_250);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "CMake is re-running because generate.stamp.list ");
      std::operator<<(poVar3,"could not be read.\n");
      stampList_local._7_1_ = false;
      stampName.field_2._8_4_ = 1;
    }
    std::ifstream::~ifstream(&local_220);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "CMake is re-running because generate.stamp.list ");
    std::operator<<(poVar3,"is missing.\n");
    stampList_local._7_1_ = false;
  }
  return stampList_local._7_1_;
}

Assistant:

static bool cmakeCheckStampList(const char* stampList)
{
  // If the stamp list does not exist CMake must rerun to generate it.
  if(!cmSystemTools::FileExists(stampList))
    {
    std::cout << "CMake is re-running because generate.stamp.list "
              << "is missing.\n";
    return false;
    }
  cmsys::ifstream fin(stampList);
  if(!fin)
    {
    std::cout << "CMake is re-running because generate.stamp.list "
              << "could not be read.\n";
    return false;
    }

  // Check each stamp.
  std::string stampName;
  while(cmSystemTools::GetLineFromStream(fin, stampName))
    {
    if(!cmakeCheckStampFile(stampName.c_str()))
      {
      return false;
      }
    }
  return true;
}